

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTiledRgbaFile.cpp
# Opt level: O0

void __thiscall
Imf_2_5::TiledRgbaOutputFile::writeTile(TiledRgbaOutputFile *this,int dx,int dy,int l)

{
  TiledOutputFile *in_RDI;
  Lock lock;
  int in_stack_00000290;
  int in_stack_00000294;
  int in_stack_00000298;
  int in_stack_0000029c;
  ToYa *in_stack_000002a0;
  int in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  Mutex *in_stack_ffffffffffffffc8;
  Lock *in_stack_ffffffffffffffd0;
  
  if (in_RDI->_streamData == (OutputStreamMutex *)0x0) {
    TiledOutputFile::writeTile(in_RDI,in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8,0);
  }
  else {
    IlmThread_2_5::Lock::Lock
              (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,SUB81((ulong)in_RDI >> 0x38,0));
    ToYa::writeTile(in_stack_000002a0,in_stack_0000029c,in_stack_00000298,in_stack_00000294,
                    in_stack_00000290);
    IlmThread_2_5::Lock::~Lock((Lock *)in_RDI);
  }
  return;
}

Assistant:

void
TiledRgbaOutputFile::writeTile (int dx, int dy, int l)
{
    if (_toYa)
    {
	Lock lock (*_toYa);
	_toYa->writeTile (dx, dy, l, l);
    }
    else
    {
	 _outputFile->writeTile (dx, dy, l);
    }
}